

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

bool __thiscall spirv_cross::CFG::post_order_visit(CFG *this,uint32_t block_id)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  mapped_type *pmVar5;
  int *piVar6;
  SPIRBlock *block_00;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this_00;
  Case *pCVar7;
  pointer ppVar8;
  size_t sVar9;
  uint *puVar10;
  uint32_t *puVar11;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  local_88;
  size_t local_80;
  size_t num_succeeding_edges;
  iterator succ_itr;
  SmallVector<unsigned_int,_8UL> *pred;
  uint32_t local_5c;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  local_58;
  iterator pred_itr;
  Case *target;
  Case *__end3;
  Case *__begin3;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *__range3;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *cases;
  SPIRBlock *block;
  CFG *pCStack_18;
  uint32_t block_id_local;
  CFG *this_local;
  
  block._4_4_ = block_id;
  pCStack_18 = this;
  bVar2 = has_visited_forward_edge(this,block_id);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = is_back_edge(this,block._4_4_);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pmVar5 = ::std::
               unordered_map<unsigned_int,_spirv_cross::CFG::VisitOrder,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>_>
               ::operator[](&this->visit_order,(key_type *)((long)&block + 4));
      piVar6 = VisitOrder::get(pmVar5);
      *piVar6 = 0;
      block_00 = Compiler::get<spirv_cross::SPIRBlock>(this->compiler,block._4_4_);
      if (block_00->merge == MergeLoop) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->merge_block);
        bVar2 = post_order_visit(this,uVar3);
        uVar3 = block._4_4_;
        if (bVar2) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->merge_block);
          add_branch(this,uVar3,uVar4);
        }
      }
      iVar1 = *(int *)&(block_00->super_IVariant).field_0xc;
      if (iVar1 == 1) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
        bVar2 = post_order_visit(this,uVar3);
        uVar3 = block._4_4_;
        if (bVar2) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
          add_branch(this,uVar3,uVar4);
        }
      }
      else if (iVar1 == 2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->true_block);
        bVar2 = post_order_visit(this,uVar3);
        uVar3 = block._4_4_;
        if (bVar2) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->true_block);
          add_branch(this,uVar3,uVar4);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->false_block);
        bVar2 = post_order_visit(this,uVar3);
        uVar3 = block._4_4_;
        if (bVar2) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->false_block);
          add_branch(this,uVar3,uVar4);
        }
      }
      else if (iVar1 == 3) {
        this_00 = Compiler::get_case_list(this->compiler,block_00);
        __end3 = VectorView<spirv_cross::SPIRBlock::Case>::begin
                           (&this_00->super_VectorView<spirv_cross::SPIRBlock::Case>);
        pCVar7 = VectorView<spirv_cross::SPIRBlock::Case>::end
                           (&this_00->super_VectorView<spirv_cross::SPIRBlock::Case>);
        for (; __end3 != pCVar7; __end3 = __end3 + 1) {
          pred_itr.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                     )(_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                       )__end3;
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end3->block);
          bVar2 = post_order_visit(this,uVar3);
          uVar3 = block._4_4_;
          if (bVar2) {
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)
                               ((long)pred_itr.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                      ._M_cur + 8));
            add_branch(this,uVar3,uVar4);
          }
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->default_block);
        if (uVar3 != 0) {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->default_block);
          bVar2 = post_order_visit(this,uVar3);
          uVar3 = block._4_4_;
          if (bVar2) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->default_block);
            add_branch(this,uVar3,uVar4);
          }
        }
      }
      if (block_00->merge == MergeSelection) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
        bVar2 = post_order_visit(this,uVar3);
        if (bVar2) {
          local_5c = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
          local_58._M_cur =
               (__node_type *)
               ::std::
               unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
               ::find(&this->preceding_edges,&local_5c);
          pred = (SmallVector<unsigned_int,_8UL> *)
                 ::std::
                 end<std::unordered_map<unsigned_int,spirv_cross::SmallVector<unsigned_int,8ul>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::SmallVector<unsigned_int,8ul>>>>>
                           (&this->preceding_edges);
          bVar2 = ::std::__detail::operator!=
                            (&local_58,
                             (_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                              *)&pred);
          uVar3 = block._4_4_;
          if (bVar2) {
            ppVar8 = ::std::__detail::
                     _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                                   *)&local_58);
            succ_itr.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                       )&ppVar8->second;
            num_succeeding_edges =
                 (size_t)::std::
                         unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
                         ::find(&this->succeeding_edges,(key_type *)((long)&block + 4));
            local_80 = 0;
            local_88._M_cur =
                 (__node_type *)
                 ::std::
                 end<std::unordered_map<unsigned_int,spirv_cross::SmallVector<unsigned_int,8ul>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::SmallVector<unsigned_int,8ul>>>>>
                           (&this->succeeding_edges);
            bVar2 = ::std::__detail::operator!=
                              ((_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                *)&num_succeeding_edges,&local_88);
            if (bVar2) {
              ppVar8 = ::std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                                     *)&num_succeeding_edges);
              local_80 = VectorView<unsigned_int>::size
                                   (&(ppVar8->second).super_VectorView<unsigned_int>);
            }
            if ((*(int *)&(block_00->super_IVariant).field_0xc == 3) && (local_80 == 1)) {
              bVar2 = VectorView<unsigned_int>::empty
                                ((VectorView<unsigned_int> *)
                                 succ_itr.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                 ._M_cur);
              uVar3 = block._4_4_;
              if (!bVar2) {
                uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
                add_branch(this,uVar3,uVar4);
              }
            }
            else {
              sVar9 = VectorView<unsigned_int>::size
                                ((VectorView<unsigned_int> *)
                                 succ_itr.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                 ._M_cur);
              if ((sVar9 == 1) &&
                 (puVar10 = VectorView<unsigned_int>::begin
                                      ((VectorView<unsigned_int> *)
                                       succ_itr.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                       ._M_cur), uVar3 = block._4_4_, *puVar10 != block._4_4_)) {
                uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
                add_branch(this,uVar3,uVar4);
              }
            }
          }
          else {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
            add_branch(this,uVar3,uVar4);
          }
        }
      }
      uVar3 = this->visit_count + 1;
      this->visit_count = uVar3;
      pmVar5 = ::std::
               unordered_map<unsigned_int,_spirv_cross::CFG::VisitOrder,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>_>
               ::operator[](&this->visit_order,(key_type *)((long)&block + 4));
      puVar11 = (uint32_t *)VisitOrder::get(pmVar5);
      *puVar11 = uVar3;
      SmallVector<unsigned_int,_8UL>::push_back(&this->post_order,(uint *)((long)&block + 4));
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFG::post_order_visit(uint32_t block_id)
{
	// If we have already branched to this block (back edge), stop recursion.
	// If our branches are back-edges, we do not record them.
	// We have to record crossing edges however.
	if (has_visited_forward_edge(block_id))
		return true;
	else if (is_back_edge(block_id))
		return false;

	// Block back-edges from recursively revisiting ourselves.
	visit_order[block_id].get() = 0;

	auto &block = compiler.get<SPIRBlock>(block_id);

	// If this is a loop header, add an implied branch to the merge target.
	// This is needed to avoid annoying cases with do { ... } while(false) loops often generated by inliners.
	// To the CFG, this is linear control flow, but we risk picking the do/while scope as our dominating block.
	// This makes sure that if we are accessing a variable outside the do/while, we choose the loop header as dominator.
	// We could use has_visited_forward_edge, but this break code-gen where the merge block is unreachable in the CFG.

	// Make a point out of visiting merge target first. This is to make sure that post visit order outside the loop
	// is lower than inside the loop, which is going to be key for some traversal algorithms like post-dominance analysis.
	// For selection constructs true/false blocks will end up visiting the merge block directly and it works out fine,
	// but for loops, only the header might end up actually branching to merge block.
	if (block.merge == SPIRBlock::MergeLoop && post_order_visit(block.merge_block))
		add_branch(block_id, block.merge_block);

	// First visit our branch targets.
	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		if (post_order_visit(block.next_block))
			add_branch(block_id, block.next_block);
		break;

	case SPIRBlock::Select:
		if (post_order_visit(block.true_block))
			add_branch(block_id, block.true_block);
		if (post_order_visit(block.false_block))
			add_branch(block_id, block.false_block);
		break;

	case SPIRBlock::MultiSelect:
	{
		const auto &cases = compiler.get_case_list(block);
		for (const auto &target : cases)
		{
			if (post_order_visit(target.block))
				add_branch(block_id, target.block);
		}
		if (block.default_block && post_order_visit(block.default_block))
			add_branch(block_id, block.default_block);
		break;
	}
	default:
		break;
	}

	// If this is a selection merge, add an implied branch to the merge target.
	// This is needed to avoid cases where an inner branch dominates the outer branch.
	// This can happen if one of the branches exit early, e.g.:
	// if (cond) { ...; break; } else { var = 100 } use_var(var);
	// We can use the variable without a Phi since there is only one possible parent here.
	// However, in this case, we need to hoist out the inner variable to outside the branch.
	// Use same strategy as loops.
	if (block.merge == SPIRBlock::MergeSelection && post_order_visit(block.next_block))
	{
		// If there is only one preceding edge to the merge block and it's not ourselves, we need a fixup.
		// Add a fake branch so any dominator in either the if (), or else () block, or a lone case statement
		// will be hoisted out to outside the selection merge.
		// If size > 1, the variable will be automatically hoisted, so we should not mess with it.
		// The exception here is switch blocks, where we can have multiple edges to merge block,
		// all coming from same scope, so be more conservative in this case.
		// Adding fake branches unconditionally breaks parameter preservation analysis,
		// which looks at how variables are accessed through the CFG.
		auto pred_itr = preceding_edges.find(block.next_block);
		if (pred_itr != end(preceding_edges))
		{
			auto &pred = pred_itr->second;
			auto succ_itr = succeeding_edges.find(block_id);
			size_t num_succeeding_edges = 0;
			if (succ_itr != end(succeeding_edges))
				num_succeeding_edges = succ_itr->second.size();

			if (block.terminator == SPIRBlock::MultiSelect && num_succeeding_edges == 1)
			{
				// Multiple branches can come from the same scope due to "break;", so we need to assume that all branches
				// come from same case scope in worst case, even if there are multiple preceding edges.
				// If we have more than one succeeding edge from the block header, it should be impossible
				// to have a dominator be inside the block.
				// Only case this can go wrong is if we have 2 or more edges from block header and
				// 2 or more edges to merge block, and still have dominator be inside a case label.
				if (!pred.empty())
					add_branch(block_id, block.next_block);
			}
			else
			{
				if (pred.size() == 1 && *pred.begin() != block_id)
					add_branch(block_id, block.next_block);
			}
		}
		else
		{
			// If the merge block does not have any preceding edges, i.e. unreachable, hallucinate it.
			// We're going to do code-gen for it, and domination analysis requires that we have at least one preceding edge.
			add_branch(block_id, block.next_block);
		}
	}

	// Then visit ourselves. Start counting at one, to let 0 be a magic value for testing back vs. crossing edges.
	visit_order[block_id].get() = ++visit_count;
	post_order.push_back(block_id);
	return true;
}